

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

TlsCryptograph * __thiscall QTlsBackend::createTlsCryptograph(QTlsBackend *this)

{
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  QDebug local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::lcSsl();
  if (((pQVar1->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_38 = pQVar1->name;
    local_50 = 2;
    local_4c = 0;
    uStack_44 = 0;
    local_3c = 0;
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_30,"The backend");
    (**(code **)(*(long *)this + 0x90))(&QStack_68,this);
    pQVar2 = QDebug::operator<<(pQVar2,(QString *)&QStack_68);
    QDebug::operator<<(pQVar2,"does not support QSslSocket");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    QDebug::~QDebug(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (TlsCryptograph *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

QTlsPrivate::TlsCryptograph *QTlsBackend::createTlsCryptograph() const
{
    REPORT_MISSING_SUPPORT("does not support QSslSocket");
    return nullptr;
}